

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall Raytracer::Image::~Image(Image *this)

{
  int local_14;
  int y;
  Image *this_local;
  
  for (local_14 = 0; local_14 < this->height; local_14 = local_14 + 1) {
    if (this->datas[local_14] != (RGB *)0x0) {
      operator_delete__(this->datas[local_14]);
    }
  }
  if (this->datas != (RGB **)0x0) {
    operator_delete__(this->datas);
  }
  return;
}

Assistant:

Raytracer::Image::~Image() {
    for(int y = 0;y<height;y++){
        delete[] datas[y];
    }
    delete[] datas;
}